

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O2

bool __thiscall
rapidjson::internal::
Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::Int64
          (Hasher<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,int64_t i)

{
  bool bVar1;
  Number n;
  U local_10;
  double local_8;
  
  local_8 = (double)i;
  local_10.i = i;
  bVar1 = WriteNumber(this,(Number *)&local_10);
  return bVar1;
}

Assistant:

bool Int64(int64_t i) { Number n; n.u.i = i; n.d = static_cast<double>(i); return WriteNumber(n); }